

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O3

bool __thiscall QPDFObjectHandle::isNameAndEquals(QPDFObjectHandle *this,string *name)

{
  bool bVar1;
  int iVar2;
  string local_40;
  
  bVar1 = isName(this);
  if (bVar1) {
    getName_abi_cxx11_(&local_40,this);
    if (local_40._M_string_length == name->_M_string_length) {
      if (local_40._M_string_length == 0) {
        bVar1 = true;
      }
      else {
        iVar2 = bcmp(local_40._M_dataplus._M_p,(name->_M_dataplus)._M_p,local_40._M_string_length);
        bVar1 = iVar2 == 0;
      }
    }
    else {
      bVar1 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool
QPDFObjectHandle::isNameAndEquals(std::string const& name) const
{
    return isName() && (getName() == name);
}